

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::TextureGatherTests::init(TextureGatherTests *this,EVP_PKEY_CTX *ctx)

{
  TextureType textureType;
  CompareMode shadowCompareMode;
  WrapMode wrapS;
  ChannelType CVar1;
  _func_int **pp_Var2;
  Context *pCVar3;
  TestNode *node;
  undefined8 extraout_RAX;
  undefined8 uVar4;
  long lVar5;
  TestNode *pTVar6;
  TestNode *pTVar7;
  TestNode *pTVar8;
  TestNode *pTVar9;
  long *plVar10;
  TextureGatherCase *pTVar11;
  TextureFormat textureFormat;
  char *pcVar12;
  long *plVar13;
  size_type *psVar14;
  ulong *puVar15;
  uint uVar16;
  char *pcVar17;
  int iVar18;
  GatherType gatherType;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ChannelOrder CVar22;
  TextureFormat textureFormat_00;
  TextureSwizzleComponent comp;
  FilterMode FVar23;
  long lVar24;
  TextureFormat textureFormat_01;
  CompareMode *pCVar25;
  long lVar26;
  bool bVar27;
  deUint32 dVar28;
  string caseName_1;
  long *local_370;
  long local_368;
  long local_360;
  long lStack_358;
  anon_struct_16_2_3ce319a5 *local_350;
  string local_348;
  TestNode *local_328;
  TestNode *local_320;
  TestNode *local_318;
  TestNode *local_310;
  string local_308;
  undefined1 *local_2e8;
  TestNode *local_2e0;
  TestNode *local_2d8;
  TestNode *local_2d0;
  int local_2c4;
  undefined1 *local_2c0;
  undefined8 local_2b8;
  undefined1 local_2b0;
  undefined7 uStack_2af;
  long *local_2a0;
  long local_298;
  long local_290;
  long lStack_288;
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  MaybeTextureSwizzle swizzle;
  anon_struct_24_2_3f8e1b6f textureSizes [2];
  anon_struct_16_2_3ce319a5 formats [4];
  string caseName;
  ios_base local_138 [264];
  
  formats[0].name = "rgba8";
  formats[0].format.order = RGBA;
  formats[0].format.type = UNORM_INT8;
  formats[1].name = "rgba8ui";
  formats[1].format = (TextureFormat)&DAT_1e00000008;
  formats[2].name = "rgba8i";
  formats[2].format.order = RGBA;
  formats[2].format.type = SIGNED_INT8;
  formats[3].name = "depth32f";
  formats[3].format.order = D;
  formats[3].format.type = FLOAT;
  textureSizes[0].name = "size_pot";
  textureSizes[0].size.m_data[0] = 0x40;
  textureSizes[0].size.m_data[1] = 0x40;
  textureSizes[0].size.m_data[2] = 3;
  textureSizes[1].name = "size_npot";
  textureSizes[1].size.m_data[0] = 0x11;
  textureSizes[1].size.m_data[1] = 0x17;
  textureSizes[1].size.m_data[2] = 3;
  local_2e8 = &local_2b0;
  uVar16 = 0;
  local_310 = (TestNode *)this;
  do {
    node = (TestNode *)operator_new(0x78);
    if (uVar16 < 4) {
      pcVar17 = &DAT_01ccb278 + *(int *)(&DAT_01ccb278 + (ulong)uVar16 * 4);
    }
    else {
      pcVar17 = (char *)0x0;
    }
    pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    if (uVar16 < 4) {
      pcVar12 = &DAT_01ccb288 + *(int *)(&DAT_01ccb288 + (ulong)uVar16 * 4);
    }
    else {
      pcVar12 = (char *)0x0;
    }
    local_2e0 = node;
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,(TestContext *)*pp_Var2,pcVar17,pcVar12)
    ;
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
    node[1]._vptr_TestNode = pp_Var2;
    tcu::TestNode::addChild((TestNode *)this,node);
    gatherType = GATHERTYPE_BASIC;
    uVar4 = extraout_RAX;
    do {
      uVar4 = CONCAT71((int7)((ulong)uVar4 >> 8),uVar16 != 0);
      if ((uVar16 != 0) != (gatherType == GATHERTYPE_BASIC)) {
        pTVar6 = node;
        if (gatherType != GATHERTYPE_BASIC) {
          node = (TestNode *)operator_new(0x78);
          pcVar17 = (char *)0x0;
          if (gatherType == GATHERTYPE_OFFSET_DYNAMIC) {
            pcVar17 = "implementation_offset";
          }
          pcVar12 = (char *)0x0;
          if (gatherType == GATHERTYPE_OFFSET_DYNAMIC) {
            pcVar12 = "Use offsets within the implementation range";
          }
          if (gatherType == GATHERTYPE_OFFSET) {
            pcVar17 = "min_required_offset";
          }
          pCVar3 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
          if (gatherType == GATHERTYPE_OFFSET) {
            pcVar12 = "Use offsets within GL minimum required range";
          }
          tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,pCVar3->m_testCtx,pcVar17,pcVar12)
          ;
          ((TestNode *)&node->_vptr_TestNode)->_vptr_TestNode =
               (_func_int **)&PTR__TestCase_021a35d0;
          ((TestNode *)&node[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar3;
          pTVar6 = local_2e0;
        }
        if (node != pTVar6) {
          tcu::TestNode::addChild(pTVar6,node);
        }
        lVar5 = 0;
        do {
          textureType = (&DAT_021b6e28)[lVar5 * 4];
          if ((uVar16 == 0) || (textureType != TEXTURETYPE_CUBE)) {
            pTVar6 = (TestNode *)operator_new(0x78);
            pCVar3 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            tcu::TestCaseGroup::TestCaseGroup
                      ((TestCaseGroup *)pTVar6,pCVar3->m_testCtx,(char *)(&DAT_021b6e20)[lVar5 * 2],
                       glcts::fixed_sample_locations_values + 1);
            pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
            pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
            tcu::TestNode::addChild(node,pTVar6);
            lVar21 = 0;
            do {
              pTVar7 = (TestNode *)operator_new(0x78);
              pCVar3 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar7,pCVar3->m_testCtx,formats[lVar21].name,
                         glcts::fixed_sample_locations_values + 1);
              local_350 = formats + lVar21;
              pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
              pTVar7[1]._vptr_TestNode = (_func_int **)pCVar3;
              tcu::TestNode::addChild(pTVar6,pTVar7);
              iVar18 = 0;
              local_320 = pTVar7;
              do {
                pTVar7 = local_320;
                pTVar8 = local_320;
                if (iVar18 != 0) {
                  pTVar8 = (TestNode *)operator_new(0x78);
                  pCVar3 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar8,pCVar3->m_testCtx,"no_corners",
                             "Test case variants that don\'t sample around cube map corners");
                  ((TestNode *)&pTVar8->_vptr_TestNode)->_vptr_TestNode =
                       (_func_int **)&PTR__TestCase_021a35d0;
                  ((TestNode *)&pTVar8[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar3;
                }
                if (pTVar7 != pTVar8) {
                  tcu::TestNode::addChild(pTVar7,pTVar8);
                }
                local_2d0 = (TestNode *)(ulong)((uint)(iVar18 != 0) * 2);
                lVar26 = 0;
                local_2c4 = iVar18;
                do {
                  pTVar7 = (TestNode *)operator_new(0x78);
                  pCVar3 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar7,pCVar3->m_testCtx,textureSizes[lVar26].name,
                             glcts::fixed_sample_locations_values + 1);
                  local_318 = (TestNode *)&textureSizes[lVar26].size;
                  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
                  pTVar7[1]._vptr_TestNode = (_func_int **)pCVar3;
                  local_2d8 = pTVar7;
                  tcu::TestNode::addChild(pTVar8,pTVar7);
                  textureFormat_00.order = R;
                  textureFormat_00.type = SNORM_INT8;
                  do {
                    pTVar7 = local_2d8;
                    CVar22 = textureFormat_00.order;
                    if ((((((local_350->format).order - D & 0xfffffffd) == 0) == (CVar22 != R)) &&
                        (CVar22 < LA)) && (CVar22 != I)) {
                      pTVar9 = local_2d8;
                      if (CVar22 != R) {
                        pTVar9 = (TestNode *)operator_new(0x78);
                        pCVar3 = (Context *)local_310[1]._vptr_TestNode;
                        local_2c0 = &local_2b0;
                        local_2b8 = 0;
                        local_2b0 = 0;
                        plVar10 = (long *)std::__cxx11::string::append((char *)&local_2c0);
                        plVar13 = plVar10 + 2;
                        if ((long *)*plVar10 == plVar13) {
                          local_290 = *plVar13;
                          lStack_288 = plVar10[3];
                          local_2a0 = &local_290;
                        }
                        else {
                          local_290 = *plVar13;
                          local_2a0 = (long *)*plVar10;
                        }
                        local_298 = plVar10[1];
                        *plVar10 = (long)plVar13;
                        plVar10[1] = 0;
                        *(undefined1 *)(plVar10 + 2) = 0;
                        plVar10 = (long *)std::__cxx11::string::append((char *)&local_2a0);
                        plVar13 = plVar10 + 2;
                        if ((long *)*plVar10 == plVar13) {
                          local_270 = *plVar13;
                          lStack_268 = plVar10[3];
                          local_280 = &local_270;
                        }
                        else {
                          local_270 = *plVar13;
                          local_280 = (long *)*plVar10;
                        }
                        local_278 = plVar10[1];
                        *plVar10 = (long)plVar13;
                        plVar10[1] = 0;
                        *(undefined1 *)(plVar10 + 2) = 0;
                        tcu::TestCaseGroup::TestCaseGroup
                                  ((TestCaseGroup *)pTVar9,pCVar3->m_testCtx,(char *)local_280,
                                   glcts::fixed_sample_locations_values + 1);
                        ((TestNode *)&pTVar9->_vptr_TestNode)->_vptr_TestNode =
                             (_func_int **)&PTR__TestCase_021a35d0;
                        ((TestNode *)&pTVar9[1]._vptr_TestNode)->_vptr_TestNode =
                             (_func_int **)pCVar3;
                      }
                      if (CVar22 != R) {
                        if (local_280 != &local_270) {
                          operator_delete(local_280,local_270 + 1);
                        }
                        if (local_2a0 != &local_290) {
                          operator_delete(local_2a0,local_290 + 1);
                        }
                        if (local_2c0 != &local_2b0) {
                          operator_delete(local_2c0,CONCAT71(uStack_2af,local_2b0) + 1);
                        }
                      }
                      if (pTVar9 != pTVar7) {
                        tcu::TestNode::addChild(pTVar7,pTVar9);
                      }
                      lVar19 = 1;
                      pCVar25 = &DAT_021b6e58;
                      local_328 = pTVar9;
                      do {
                        shadowCompareMode = *pCVar25;
                        lVar24 = 0;
                        if (lVar19 != 3) {
                          lVar24 = lVar19;
                        }
                        wrapS = (&DAT_021b6e58)[lVar24 * 4];
                        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
                        local_348._M_string_length = 0;
                        local_348.field_2._M_allocated_capacity =
                             local_348.field_2._M_allocated_capacity & 0xffffffffffffff00;
                        plVar10 = (long *)std::__cxx11::string::append((char *)&local_348);
                        local_370 = &local_360;
                        plVar13 = plVar10 + 2;
                        if ((long *)*plVar10 == plVar13) {
                          local_360 = *plVar13;
                          lStack_358 = plVar10[3];
                        }
                        else {
                          local_360 = *plVar13;
                          local_370 = (long *)*plVar10;
                        }
                        local_368 = plVar10[1];
                        *plVar10 = (long)plVar13;
                        plVar10[1] = 0;
                        *(undefined1 *)(plVar10 + 2) = 0;
                        plVar10 = (long *)std::__cxx11::string::append((char *)&local_370);
                        caseName_1._M_dataplus._M_p = (pointer)&caseName_1.field_2;
                        psVar14 = (size_type *)(plVar10 + 2);
                        if ((size_type *)*plVar10 == psVar14) {
                          caseName_1.field_2._M_allocated_capacity = *psVar14;
                          caseName_1.field_2._8_8_ = plVar10[3];
                        }
                        else {
                          caseName_1.field_2._M_allocated_capacity = *psVar14;
                          caseName_1._M_dataplus._M_p = (pointer)*plVar10;
                        }
                        caseName_1._M_string_length = plVar10[1];
                        *plVar10 = (long)psVar14;
                        plVar10[1] = 0;
                        *(undefined1 *)(plVar10 + 2) = 0;
                        dVar28 = 0x1653acc;
                        plVar10 = (long *)std::__cxx11::string::append((char *)&caseName_1);
                        caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
                        psVar14 = (size_type *)(plVar10 + 2);
                        if ((size_type *)*plVar10 == psVar14) {
                          caseName.field_2._M_allocated_capacity = *psVar14;
                          caseName.field_2._8_8_ = plVar10[3];
                        }
                        else {
                          caseName.field_2._M_allocated_capacity = *psVar14;
                          caseName._M_dataplus._M_p = (pointer)*plVar10;
                        }
                        caseName._M_string_length = plVar10[1];
                        *plVar10 = (long)psVar14;
                        plVar10[1] = 0;
                        *(undefined1 *)(plVar10 + 2) = 0;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                          dVar28 = 0x1653b3d;
                          operator_delete(caseName_1._M_dataplus._M_p,
                                          caseName_1.field_2._M_allocated_capacity + 1);
                        }
                        if (local_370 != &local_360) {
                          dVar28 = 0x1653b59;
                          operator_delete(local_370,local_360 + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_348._M_dataplus._M_p != &local_348.field_2) {
                          dVar28 = 0x1653b75;
                          operator_delete(local_348._M_dataplus._M_p,
                                          local_348.field_2._M_allocated_capacity + 1);
                        }
                        caseName_1._M_dataplus._M_p = (pointer)0x600000006;
                        caseName_1._M_string_length = 0x600000006;
                        caseName_1.field_2._M_allocated_capacity =
                             caseName_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
                        pTVar11 = Functional::anon_unknown_0::makeTextureGatherCase
                                            (textureType,(Context *)local_310[1]._vptr_TestNode,
                                             caseName._M_dataplus._M_p,(char *)(ulong)uVar16,
                                             gatherType,(local_350->format).order,textureFormat_00,
                                             shadowCompareMode,wrapS,(WrapMode)&caseName_1,
                                             (MaybeTextureSwizzle *)0x0,NEAREST,NEAREST,
                                             (int)local_318,(IVec3 *)local_2d0,dVar28);
                        tcu::TestNode::addChild(local_328,(TestNode *)pTVar11);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)caseName._M_dataplus._M_p != &caseName.field_2) {
                          operator_delete(caseName._M_dataplus._M_p,
                                          caseName.field_2._M_allocated_capacity + 1);
                        }
                        pCVar25 = pCVar25 + 4;
                        lVar19 = lVar19 + 1;
                      } while (lVar19 != 4);
                    }
                    pTVar7 = local_310;
                    textureFormat_00.order = CVar22 + A;
                    textureFormat_00.type = SNORM_INT8;
                  } while (textureFormat_00.order != 9);
                  bVar27 = lVar26 == 0;
                  lVar26 = lVar26 + 1;
                  this = (TextureGatherTests *)local_310;
                } while (bVar27);
              } while ((local_2c4 == 0) && (iVar18 = 1, textureType == TEXTURETYPE_CUBE));
              if (gatherType != GATHERTYPE_OFFSET) {
                CVar22 = (local_350->format).order;
                if ((CVar22 != D) && (CVar22 != DS)) {
                  pTVar8 = (TestNode *)operator_new(0x78);
                  pCVar3 = (Context *)pTVar7[1]._vptr_TestNode;
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar8,pCVar3->m_testCtx,"texture_swizzle",
                             glcts::fixed_sample_locations_values + 1);
                  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
                  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar3;
                  tcu::TestNode::addChild(local_320,pTVar8);
                  pTVar9 = (TestNode *)0x0;
                  local_318 = pTVar8;
                  do {
                    swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_R;
                    swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_G;
                    swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_B;
                    swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_A;
                    swizzle.m_isSome = true;
                    caseName_1._M_dataplus._M_p = (pointer)&caseName_1.field_2;
                    caseName_1._M_string_length = 0;
                    caseName_1.field_2._M_allocated_capacity =
                         caseName_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    uVar20 = (ulong)pTVar9 & 0xffffffff;
                    lVar26 = 0;
                    local_328 = pTVar9;
                    do {
                      comp = (int)uVar20 + (int)(uVar20 / 6) * -6;
                      swizzle.m_swizzle.m_data[lVar26] = comp;
                      pcVar17 = "";
                      if (lVar26 != 0) {
                        pcVar17 = "_";
                      }
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
                      Functional::anon_unknown_0::operator<<((ostream *)&caseName,comp);
                      std::__cxx11::stringbuf::str();
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
                      std::ios_base::~ios_base(local_138);
                      de::toLower(&local_348,&local_308);
                      plVar10 = (long *)std::__cxx11::string::replace
                                                  ((ulong)&local_348,0,(char *)0x0,(ulong)pcVar17);
                      local_370 = &local_360;
                      plVar13 = plVar10 + 2;
                      if ((long *)*plVar10 == plVar13) {
                        local_360 = *plVar13;
                        lStack_358 = plVar10[3];
                      }
                      else {
                        local_360 = *plVar13;
                        local_370 = (long *)*plVar10;
                      }
                      local_368 = plVar10[1];
                      *plVar10 = (long)plVar13;
                      plVar10[1] = 0;
                      *(undefined1 *)(plVar10 + 2) = 0;
                      dVar28 = 0x1653e55;
                      std::__cxx11::string::_M_append((char *)&caseName_1,(ulong)local_370);
                      if (local_370 != &local_360) {
                        dVar28 = 0x1653e71;
                        operator_delete(local_370,local_360 + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p != &local_348.field_2) {
                        dVar28 = 0x1653e8d;
                        operator_delete(local_348._M_dataplus._M_p,
                                        local_348.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_308._M_dataplus._M_p != &local_308.field_2) {
                        dVar28 = 0x1653eb2;
                        operator_delete(local_308._M_dataplus._M_p,
                                        CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,
                                                 local_308.field_2._M_local_buf[0]) + 1);
                      }
                      lVar26 = lVar26 + 1;
                      uVar20 = (ulong)((int)uVar20 + 1);
                    } while (lVar26 != 4);
                    caseName._M_dataplus._M_p = (pointer)0x4000000040;
                    caseName._M_string_length = CONCAT44(caseName._M_string_length._4_4_,3);
                    pTVar11 = Functional::anon_unknown_0::makeTextureGatherCase
                                        (textureType,(Context *)pTVar7[1]._vptr_TestNode,
                                         caseName_1._M_dataplus._M_p,(char *)(ulong)uVar16,
                                         gatherType,(local_350->format).order,(TextureFormat)0x0,
                                         COMPAREMODE_LESS_OR_EQUAL,REPEAT_GL,(WrapMode)&swizzle,
                                         (MaybeTextureSwizzle *)0x0,NEAREST,NEAREST,(int)&caseName,
                                         (IVec3 *)0x0,dVar28);
                    tcu::TestNode::addChild(local_318,(TestNode *)pTVar11);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                      operator_delete(caseName_1._M_dataplus._M_p,
                                      caseName_1.field_2._M_allocated_capacity + 1);
                    }
                    pTVar9 = (TestNode *)((long)&local_328->_vptr_TestNode + 1);
                  } while (pTVar9 != (TestNode *)0x6);
                }
                pTVar8 = (TestNode *)operator_new(0x78);
                pCVar3 = (Context *)pTVar7[1]._vptr_TestNode;
                tcu::TestCaseGroup::TestCaseGroup
                          ((TestCaseGroup *)pTVar8,pCVar3->m_testCtx,"filter_mode",
                           "Test that filter modes have no effect");
                pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
                pTVar8[1]._vptr_TestNode = (_func_int **)pCVar3;
                local_2d0 = pTVar8;
                tcu::TestNode::addChild(local_320,pTVar8);
                pTVar7 = (TestNode *)0x0;
                do {
                  local_318 = (TestNode *)(&DAT_021b6ea0 + (long)pTVar7 * 2);
                  local_328 = (TestNode *)(ulong)(uint)(&DAT_021b6ea8)[(long)pTVar7 * 4];
                  lVar26 = 0;
                  local_2d8 = pTVar7;
                  do {
                    FVar23 = *(FilterMode *)((long)&DAT_021b6e88 + lVar26);
                    CVar1 = (local_350->format).type;
                    bVar27 = ((local_350->format).order - D & 0xfffffffd) == 0;
                    if ((CVar1 < UNORM_BYTE_44) && ((0x58U >> (CVar1 & UNSIGNED_INT16) & 1) != 0)) {
                      if (FVar23 != NEAREST) {
LAB_01654051:
                        if ((CVar1 < HALF_FLOAT) &&
                           ((0x2c0000000U >> ((ulong)CVar1 & 0x3f) & 1) != 0)) {
                          if ((FVar23 == NEAREST) && ((int)local_328 == 2)) {
LAB_01654083:
                            local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
                            local_308._M_string_length = 0;
                            local_308.field_2._M_local_buf[0] = '\0';
                            plVar10 = (long *)std::__cxx11::string::append((char *)&local_308);
                            puVar15 = (ulong *)(plVar10 + 2);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)*plVar10 ==
                                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)puVar15) {
                              local_348.field_2._M_allocated_capacity = *puVar15;
                              local_348.field_2._8_8_ = plVar10[3];
                              local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
                            }
                            else {
                              local_348.field_2._M_allocated_capacity = *puVar15;
                              local_348._M_dataplus._M_p = (pointer)*plVar10;
                            }
                            local_348._M_string_length = plVar10[1];
                            *plVar10 = (long)puVar15;
                            plVar10[1] = 0;
                            *(undefined1 *)(plVar10 + 2) = 0;
                            plVar10 = (long *)std::__cxx11::string::append((char *)&local_348);
                            local_370 = &local_360;
                            plVar13 = plVar10 + 2;
                            if ((long *)*plVar10 == plVar13) {
                              local_360 = *plVar13;
                              lStack_358 = plVar10[3];
                            }
                            else {
                              local_360 = *plVar13;
                              local_370 = (long *)*plVar10;
                            }
                            local_368 = plVar10[1];
                            *plVar10 = (long)plVar13;
                            plVar10[1] = 0;
                            *(undefined1 *)(plVar10 + 2) = 0;
                            plVar10 = (long *)std::__cxx11::string::append((char *)&local_370);
                            caseName_1._M_dataplus._M_p = (pointer)&caseName_1.field_2;
                            psVar14 = (size_type *)(plVar10 + 2);
                            if ((size_type *)*plVar10 == psVar14) {
                              caseName_1.field_2._M_allocated_capacity = *psVar14;
                              caseName_1.field_2._8_8_ = plVar10[3];
                            }
                            else {
                              caseName_1.field_2._M_allocated_capacity = *psVar14;
                              caseName_1._M_dataplus._M_p = (pointer)*plVar10;
                            }
                            caseName_1._M_string_length = plVar10[1];
                            *plVar10 = (long)psVar14;
                            plVar10[1] = 0;
                            *(undefined1 *)(plVar10 + 2) = 0;
                            dVar28 = 0x16541e6;
                            plVar10 = (long *)std::__cxx11::string::append((char *)&caseName_1);
                            caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
                            psVar14 = (size_type *)(plVar10 + 2);
                            if ((size_type *)*plVar10 == psVar14) {
                              caseName.field_2._M_allocated_capacity = *psVar14;
                              caseName.field_2._8_8_ = plVar10[3];
                            }
                            else {
                              caseName.field_2._M_allocated_capacity = *psVar14;
                              caseName._M_dataplus._M_p = (pointer)*plVar10;
                            }
                            caseName._M_string_length = plVar10[1];
                            *plVar10 = (long)psVar14;
                            plVar10[1] = 0;
                            *(undefined1 *)(plVar10 + 2) = 0;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                              dVar28 = 0x1654257;
                              operator_delete(caseName_1._M_dataplus._M_p,
                                              caseName_1.field_2._M_allocated_capacity + 1);
                            }
                            if (local_370 != &local_360) {
                              dVar28 = 0x1654273;
                              operator_delete(local_370,local_360 + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
                              dVar28 = 0x165428a;
                              operator_delete(local_348._M_dataplus._M_p,
                                              local_348.field_2._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_308._M_dataplus._M_p != &local_308.field_2) {
                              dVar28 = 0x16542af;
                              operator_delete(local_308._M_dataplus._M_p,
                                              CONCAT71(local_308.field_2._M_allocated_capacity._1_7_
                                                       ,local_308.field_2._M_local_buf[0]) + 1);
                            }
                            textureFormat_01._1_7_ = 0;
                            textureFormat_01.order._0_1_ = bVar27;
                            caseName_1._M_dataplus._M_p = (pointer)0x600000006;
                            caseName_1._M_string_length = 0x600000006;
                            caseName_1.field_2._M_allocated_capacity =
                                 caseName_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
                            local_370 = (long *)0x4000000040;
                            local_368 = CONCAT44(local_368._4_4_,3);
                            pTVar11 = Functional::anon_unknown_0::makeTextureGatherCase
                                                (textureType,(Context *)local_310[1]._vptr_TestNode,
                                                 caseName._M_dataplus._M_p,(char *)(ulong)uVar16,
                                                 gatherType,(local_350->format).order,
                                                 textureFormat_01,COMPAREMODE_LESS_OR_EQUAL,
                                                 REPEAT_GL,(WrapMode)&caseName_1,
                                                 (MaybeTextureSwizzle *)local_328,FVar23,NEAREST,
                                                 (int)&local_370,(IVec3 *)0x0,dVar28);
                            tcu::TestNode::addChild(local_2d0,(TestNode *)pTVar11);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)caseName._M_dataplus._M_p != &caseName.field_2) {
                              operator_delete(caseName._M_dataplus._M_p,
                                              caseName.field_2._M_allocated_capacity + 1);
                            }
                          }
                        }
                        else if ((2 < CVar1 - SIGNED_INT8) ||
                                ((int)local_328 == 2 && FVar23 == NEAREST)) goto LAB_01654083;
                      }
                    }
                    else if (!bVar27 || FVar23 != NEAREST) goto LAB_01654051;
                    lVar26 = lVar26 + 0x10;
                  } while (lVar26 == 0x10);
                  pTVar7 = (TestNode *)((long)&local_2d8->_vptr_TestNode + 1);
                } while (pTVar7 != (TestNode *)0x5);
                pTVar7 = (TestNode *)operator_new(0x78);
                this = (TextureGatherTests *)local_310;
                pCVar3 = (Context *)local_310[1]._vptr_TestNode;
                tcu::TestCaseGroup::TestCaseGroup
                          ((TestCaseGroup *)pTVar7,pCVar3->m_testCtx,"base_level",
                           glcts::fixed_sample_locations_values + 1);
                pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
                pTVar7[1]._vptr_TestNode = (_func_int **)pCVar3;
                tcu::TestNode::addChild(local_320,pTVar7);
                FVar23 = LINEAR;
                do {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
                  std::ostream::operator<<(&caseName,FVar23);
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
                  std::ios_base::~ios_base(local_138);
                  dVar28 = 0x1654451;
                  plVar10 = (long *)std::__cxx11::string::replace
                                              ((ulong)&local_370,0,(char *)0x0,0x1ca9870);
                  caseName_1._M_dataplus._M_p = (pointer)&caseName_1.field_2;
                  psVar14 = (size_type *)(plVar10 + 2);
                  if ((size_type *)*plVar10 == psVar14) {
                    caseName_1.field_2._M_allocated_capacity = *psVar14;
                    caseName_1.field_2._8_8_ = plVar10[3];
                  }
                  else {
                    caseName_1.field_2._M_allocated_capacity = *psVar14;
                    caseName_1._M_dataplus._M_p = (pointer)*plVar10;
                  }
                  caseName_1._M_string_length = plVar10[1];
                  *plVar10 = (long)psVar14;
                  plVar10[1] = 0;
                  *(undefined1 *)(plVar10 + 2) = 0;
                  if (local_370 != &local_360) {
                    dVar28 = 0x16544b3;
                    operator_delete(local_370,local_360 + 1);
                  }
                  textureFormat._1_7_ = 0;
                  textureFormat.order._0_1_ = ((local_350->format).order - D & 0xfffffffd) == 0;
                  caseName._M_dataplus._M_p = (pointer)0x600000006;
                  caseName._M_string_length = 0x600000006;
                  caseName.field_2._M_allocated_capacity =
                       caseName.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  local_370 = (long *)0x4000000040;
                  local_368 = CONCAT44(local_368._4_4_,3);
                  pTVar11 = Functional::anon_unknown_0::makeTextureGatherCase
                                      (textureType,
                                       (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                                       caseName_1._M_dataplus._M_p,(char *)(ulong)uVar16,gatherType,
                                       (local_350->format).order,textureFormat,
                                       COMPAREMODE_LESS_OR_EQUAL,REPEAT_GL,(WrapMode)&caseName,
                                       (MaybeTextureSwizzle *)0x0,NEAREST,FVar23,(int)&local_370,
                                       (IVec3 *)0x0,dVar28);
                  tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar11);
                  pTVar8 = local_320;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                    operator_delete(caseName_1._M_dataplus._M_p,
                                    caseName_1.field_2._M_allocated_capacity + 1);
                  }
                  FVar23 = FVar23 + LINEAR;
                } while (FVar23 != NEAREST_MIPMAP_LINEAR);
                CVar22 = (local_350->format).order;
                if ((((CVar22 != D) && (CVar22 != DS)) &&
                    (CVar1 = (local_350->format).type, 2 < CVar1 - SIGNED_INT8)) &&
                   ((UNSIGNED_INT32 < CVar1 || ((0x2c0000000U >> ((ulong)CVar1 & 0x3f) & 1) == 0))))
                {
                  pTVar7 = (TestNode *)operator_new(0x78);
                  pCVar3 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar7,pCVar3->m_testCtx,"incomplete",
                             "Test that textureGather* takes components from (0,0,0,1) for incomplete textures"
                            );
                  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
                  pTVar7[1]._vptr_TestNode = (_func_int **)pCVar3;
                  dVar28 = 0x165460a;
                  tcu::TestNode::addChild(pTVar8,pTVar7);
                  caseName._M_dataplus._M_p = (pointer)0x600000006;
                  caseName._M_string_length = 0x600000006;
                  caseName.field_2._M_allocated_capacity =
                       caseName.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  caseName_1._M_dataplus._M_p = (pointer)0x4000000040;
                  caseName_1._M_string_length = CONCAT44(caseName_1._M_string_length._4_4_,3);
                  pTVar11 = Functional::anon_unknown_0::makeTextureGatherCase
                                      (textureType,
                                       (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                                       "mipmap_incomplete",(char *)(ulong)uVar16,gatherType,
                                       (local_350->format).order,(TextureFormat)0x0,
                                       COMPAREMODE_LESS_OR_EQUAL,REPEAT_GL,(WrapMode)&caseName,
                                       (MaybeTextureSwizzle *)0x2,NEAREST,NEAREST,(int)&caseName_1,
                                       (IVec3 *)&DAT_00000001,dVar28);
                  tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar11);
                }
              }
              lVar21 = lVar21 + 1;
            } while (lVar21 != 4);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        uVar4 = 3;
        node = local_2e0;
      }
      gatherType = gatherType + GATHERTYPE_OFFSET;
    } while (gatherType != GATHERTYPE_OFFSETS);
    uVar16 = uVar16 + 1;
    if (uVar16 == 4) {
      return (int)uVar4;
    }
  } while( true );
}

Assistant:

void TextureGatherTests::init (void)
{
	const struct
	{
		const char* name;
		TextureType type;
	} textureTypes[] =
	{
		{ "2d",			TEXTURETYPE_2D			},
		{ "2d_array",	TEXTURETYPE_2D_ARRAY	},
		{ "cube",		TEXTURETYPE_CUBE		}
	};

	const struct
	{
		const char*			name;
		tcu::TextureFormat	format;
	} formats[] =
	{
		{ "rgba8",		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_INT8)		},
		{ "rgba8ui",	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT8)	},
		{ "rgba8i",		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT8)	},
		{ "depth32f",	tcu::TextureFormat(tcu::TextureFormat::D,		tcu::TextureFormat::FLOAT)			}
	};

	const struct
	{
		const char*		name;
		IVec3			size;
	} textureSizes[] =
	{
		{ "size_pot",	IVec3(64, 64, 3) },
		{ "size_npot",	IVec3(17, 23, 3) }
	};

	const struct
	{
		const char*				name;
		tcu::Sampler::WrapMode	mode;
	} wrapModes[] =
	{
		{ "clamp_to_edge",		tcu::Sampler::CLAMP_TO_EDGE			},
		{ "repeat",				tcu::Sampler::REPEAT_GL				},
		{ "mirrored_repeat",	tcu::Sampler::MIRRORED_REPEAT_GL	}
	};

	for (int gatherTypeI = 0; gatherTypeI < GATHERTYPE_LAST; gatherTypeI++)
	{
		const GatherType		gatherType			= (GatherType)gatherTypeI;
		TestCaseGroup* const	gatherTypeGroup		= new TestCaseGroup(m_context, gatherTypeName(gatherType), gatherTypeDescription(gatherType));
		addChild(gatherTypeGroup);

		for (int offsetSizeI = 0; offsetSizeI < OFFSETSIZE_LAST; offsetSizeI++)
		{
			const OffsetSize offsetSize = (OffsetSize)offsetSizeI;
			if ((gatherType == GATHERTYPE_BASIC) != (offsetSize == OFFSETSIZE_NONE))
				continue;

			TestCaseGroup* const offsetSizeGroup = offsetSize == OFFSETSIZE_NONE ?
													gatherTypeGroup :
													new TestCaseGroup(m_context,
																	  offsetSize == OFFSETSIZE_MINIMUM_REQUIRED				? "min_required_offset"
																	  : offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM		? "implementation_offset"
																	  : DE_NULL,
																	  offsetSize == OFFSETSIZE_MINIMUM_REQUIRED				? "Use offsets within GL minimum required range"
																	  : offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM		? "Use offsets within the implementation range"
																	  : DE_NULL);
			if (offsetSizeGroup != gatherTypeGroup)
				gatherTypeGroup->addChild(offsetSizeGroup);

			for (int textureTypeNdx = 0; textureTypeNdx < DE_LENGTH_OF_ARRAY(textureTypes); textureTypeNdx++)
			{
				const TextureType textureType = textureTypes[textureTypeNdx].type;

				if (textureType == TEXTURETYPE_CUBE && gatherType != GATHERTYPE_BASIC)
					continue;

				TestCaseGroup* const textureTypeGroup = new TestCaseGroup(m_context, textureTypes[textureTypeNdx].name, "");
				offsetSizeGroup->addChild(textureTypeGroup);

				for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const tcu::TextureFormat&	format			= formats[formatNdx].format;
					TestCaseGroup* const		formatGroup		= new TestCaseGroup(m_context, formats[formatNdx].name, "");
					textureTypeGroup->addChild(formatGroup);

					for (int noCornersI = 0; noCornersI <= ((textureType == TEXTURETYPE_CUBE)?1:0); noCornersI++)
					{
						const bool				noCorners		= noCornersI!= 0;
						TestCaseGroup* const	cornersGroup	= noCorners
																? new TestCaseGroup(m_context, "no_corners", "Test case variants that don't sample around cube map corners")
																: formatGroup;

						if (formatGroup != cornersGroup)
							formatGroup->addChild(cornersGroup);

						for (int textureSizeNdx = 0; textureSizeNdx < DE_LENGTH_OF_ARRAY(textureSizes); textureSizeNdx++)
						{
							const IVec3&			textureSize			= textureSizes[textureSizeNdx].size;
							TestCaseGroup* const	textureSizeGroup	= new TestCaseGroup(m_context, textureSizes[textureSizeNdx].name, "");
							cornersGroup->addChild(textureSizeGroup);

							for (int compareModeI = 0; compareModeI < tcu::Sampler::COMPAREMODE_LAST; compareModeI++)
							{
								const tcu::Sampler::CompareMode compareMode = (tcu::Sampler::CompareMode)compareModeI;

								if ((compareMode != tcu::Sampler::COMPAREMODE_NONE) != isDepthFormat(format))
									continue;

								if (compareMode != tcu::Sampler::COMPAREMODE_NONE &&
									compareMode != tcu::Sampler::COMPAREMODE_LESS &&
									compareMode != tcu::Sampler::COMPAREMODE_GREATER)
									continue;

								TestCaseGroup* const compareModeGroup = compareMode == tcu::Sampler::COMPAREMODE_NONE ?
																			textureSizeGroup :
																			new TestCaseGroup(m_context,
																							  (string() + "compare_" + compareModeName(compareMode)).c_str(),
																							  "");
								if (compareModeGroup != textureSizeGroup)
									textureSizeGroup->addChild(compareModeGroup);

								for (int wrapCaseNdx = 0; wrapCaseNdx < DE_LENGTH_OF_ARRAY(wrapModes); wrapCaseNdx++)
								{
									const int						wrapSNdx	= wrapCaseNdx;
									const int						wrapTNdx	= (wrapCaseNdx + 1) % DE_LENGTH_OF_ARRAY(wrapModes);
									const tcu::Sampler::WrapMode	wrapS		= wrapModes[wrapSNdx].mode;
									const tcu::Sampler::WrapMode	wrapT		= wrapModes[wrapTNdx].mode;

									const string caseName = string() + wrapModes[wrapSNdx].name + "_" + wrapModes[wrapTNdx].name;

									compareModeGroup->addChild(makeTextureGatherCase(textureType, m_context, caseName.c_str(), "", gatherType, offsetSize, format, compareMode, wrapS, wrapT,
																					 MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, textureSize,
																					 noCorners ? GATHERCASE_DONT_SAMPLE_CUBE_CORNERS : 0));
								}
							}
						}
					}

					if (offsetSize != OFFSETSIZE_MINIMUM_REQUIRED) // Don't test all features for both offset size types, as they should be rather orthogonal.
					{
						if (!isDepthFormat(format))
						{
							TestCaseGroup* const swizzleGroup = new TestCaseGroup(m_context, "texture_swizzle", "");
							formatGroup->addChild(swizzleGroup);

							DE_STATIC_ASSERT(TEXTURESWIZZLECOMPONENT_R == 0);
							for (int swizzleCaseNdx = 0; swizzleCaseNdx < TEXTURESWIZZLECOMPONENT_LAST; swizzleCaseNdx++)
							{
								MaybeTextureSwizzle	swizzle	= MaybeTextureSwizzle::createSomeTextureSwizzle();
								string				caseName;

								for (int i = 0; i < 4; i++)
								{
									swizzle.getSwizzle()[i] = (TextureSwizzleComponent)((swizzleCaseNdx + i) % (int)TEXTURESWIZZLECOMPONENT_LAST);
									caseName += (i > 0 ? "_" : "") + de::toLower(de::toString(swizzle.getSwizzle()[i]));
								}

								swizzleGroup->addChild(makeTextureGatherCase(textureType, m_context, caseName.c_str(), "", gatherType, offsetSize, format,
																			 tcu::Sampler::COMPAREMODE_NONE, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			 swizzle, tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, IVec3(64, 64, 3)));
							}
						}

						{
							TestCaseGroup* const filterModeGroup = new TestCaseGroup(m_context, "filter_mode", "Test that filter modes have no effect");
							formatGroup->addChild(filterModeGroup);

							const struct
							{
								const char*					name;
								tcu::Sampler::FilterMode	filter;
							} magFilters[] =
							{
								{ "linear",		tcu::Sampler::LINEAR	},
								{ "nearest",	tcu::Sampler::NEAREST	}
							};

							const struct
							{
								const char*					name;
								tcu::Sampler::FilterMode	filter;
							} minFilters[] =
							{
								// \note Don't test NEAREST here, as it's covered by other cases.
								{ "linear",						tcu::Sampler::LINEAR					},
								{ "nearest_mipmap_nearest",		tcu::Sampler::NEAREST_MIPMAP_NEAREST	},
								{ "nearest_mipmap_linear",		tcu::Sampler::NEAREST_MIPMAP_LINEAR		},
								{ "linear_mipmap_nearest",		tcu::Sampler::LINEAR_MIPMAP_NEAREST		},
								{ "linear_mipmap_linear",		tcu::Sampler::LINEAR_MIPMAP_LINEAR		},
							};

							for (int minFilterNdx = 0; minFilterNdx < DE_LENGTH_OF_ARRAY(minFilters); minFilterNdx++)
							for (int magFilterNdx = 0; magFilterNdx < DE_LENGTH_OF_ARRAY(magFilters); magFilterNdx++)
							{
								const tcu::Sampler::FilterMode		minFilter		= minFilters[minFilterNdx].filter;
								const tcu::Sampler::FilterMode		magFilter		= magFilters[magFilterNdx].filter;
								const tcu::Sampler::CompareMode		compareMode		= isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;

								if ((isUnormFormatType(format.type) || isDepthFormat(format)) && magFilter == tcu::Sampler::NEAREST)
									continue; // Covered by other cases.
								if ((isUIntFormatType(format.type) || isSIntFormatType(format.type)) &&
									(magFilter != tcu::Sampler::NEAREST || minFilter != tcu::Sampler::NEAREST_MIPMAP_NEAREST))
									continue;

								const string caseName = string() + "min_" + minFilters[minFilterNdx].name + "_mag_" + magFilters[magFilterNdx].name;

								filterModeGroup->addChild(makeTextureGatherCase(textureType, m_context, caseName.c_str(), "", gatherType, offsetSize, format, compareMode,
																				tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, MaybeTextureSwizzle::createNoneTextureSwizzle(),
																				minFilter, magFilter, 0, IVec3(64, 64, 3)));
							}
						}

						{
							TestCaseGroup* const baseLevelGroup = new TestCaseGroup(m_context, "base_level", "");
							formatGroup->addChild(baseLevelGroup);

							for (int baseLevel = 1; baseLevel <= 2; baseLevel++)
							{
								const string						caseName		= "level_" + de::toString(baseLevel);
								const tcu::Sampler::CompareMode		compareMode		= isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;
								baseLevelGroup->addChild(makeTextureGatherCase(textureType, m_context, caseName.c_str(), "", gatherType, offsetSize, format,
																			   compareMode, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			   MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST,
																			   baseLevel, IVec3(64, 64, 3)));
							}
						}

						// What shadow textures should return for incomplete textures is unclear.
						// Integer and unsigned integer lookups from incomplete textures return undefined values.
						if (!isDepthFormat(format) && !isSIntFormatType(format.type) && !isUIntFormatType(format.type))
						{
							TestCaseGroup* const incompleteGroup = new TestCaseGroup(m_context, "incomplete", "Test that textureGather* takes components from (0,0,0,1) for incomplete textures");
							formatGroup->addChild(incompleteGroup);

							const tcu::Sampler::CompareMode compareMode = isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;
							incompleteGroup->addChild(makeTextureGatherCase(textureType, m_context, "mipmap_incomplete", "", gatherType, offsetSize, format,
																			compareMode, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST_MIPMAP_NEAREST, tcu::Sampler::NEAREST,
																			0, IVec3(64, 64, 3), GATHERCASE_MIPMAP_INCOMPLETE));
						}
					}
				}
			}
		}
	}
}